

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-opt.h
# Opt level: O0

Option_Type __thiscall mp::TypedSolverOption<int>::type(TypedSolverOption<int> *this)

{
  TypedSolverOption<int> *this_local;
  
  return INT;
}

Assistant:

virtual Option_Type type() override {
    if (std::is_integral<T>::value)
      return Option_Type::INT;
    if (std::is_arithmetic<T>::value)
      return Option_Type::DBL;
    if (typeid(T) == typeid(std::string))
      return Option_Type::STRING;
    throw std::runtime_error("Type not found!");
  }